

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_filter.cpp
# Opt level: O3

void __thiscall duckdb::DynamicFilterData::SetValue(DynamicFilterData *this,Value *val)

{
  int iVar1;
  pointer this_00;
  ConstantFilter *pCVar2;
  
  if (val->is_null != false) {
    return;
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    this_00 = unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>,_true>
              ::operator->(&this->filter);
    pCVar2 = TableFilter::Cast<duckdb::ConstantFilter>(&this_00->super_TableFilter);
    Value::operator=(&pCVar2->constant,val);
    this->initialized = true;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void DynamicFilterData::SetValue(Value val) {
	if (val.IsNull()) {
		return;
	}
	lock_guard<mutex> l(lock);
	filter->Cast<ConstantFilter>().constant = std::move(val);
	initialized = true;
}